

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

void __thiscall QAbstractScrollArea::setViewport(QAbstractScrollArea *this,QWidget *widget)

{
  QAbstractScrollAreaPrivate *this_00;
  QWidget *pQVar1;
  
  this_00 = *(QAbstractScrollAreaPrivate **)(this + 8);
  pQVar1 = this_00->viewport;
  if (pQVar1 != widget) {
    if (widget == (QWidget *)0x0) {
      widget = (QWidget *)operator_new(0x28);
      QWidget::QWidget(widget,(QWidget *)0x0,(WindowFlags)0x0);
    }
    this_00->viewport = widget;
    QWidget::setParent(widget,(QWidget *)this);
    QWidget::setFocusProxy(this_00->viewport,(QWidget *)this);
    QObject::installEventFilter(&this_00->viewport->super_QObject);
    QWidget::grabGesture(this_00->viewport,PanGesture,(GestureFlags)0x0);
    QAbstractScrollAreaPrivate::layoutChildren(this_00);
    (**(code **)(**(long **)&this_00->viewport->field_0x8 + 0x80))();
    if ((*(byte *)(*(long *)(this + 0x20) + 9) & 0x80) != 0) {
      QWidget::show(this_00->viewport);
    }
    (**(code **)(*(long *)this + 0x1a8))(this,widget);
    if (pQVar1 != (QWidget *)0x0) {
      (**(code **)(*(long *)pQVar1 + 0x20))(pQVar1);
      return;
    }
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }